

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_contracthashutil.cpp
# Opt level: O0

void __thiscall
ContractHashUtil_GetContractScriptMultisig1of1_Test::
~ContractHashUtil_GetContractScriptMultisig1of1_Test
          (ContractHashUtil_GetContractScriptMultisig1of1_Test *this)

{
  ContractHashUtil_GetContractScriptMultisig1of1_Test *this_local;
  
  ~ContractHashUtil_GetContractScriptMultisig1of1_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ContractHashUtil, GetContractScriptMultisig1of1) {
  Script claim_script("0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb");
  Script fedpeg_script("512103198de2cfbd1cc09a15ce0eb8e23150243887e13c205a72ddbcf0ab1be529e79751ae");
  Script script;
  EXPECT_NO_THROW(
      (script = ContractHashUtil::GetContractScript(claim_script,
          fedpeg_script)));
  EXPECT_STREQ(
      script.GetHex().c_str(),
      "512102e822fbeefbfdc55f3577a5e78ad297a4bcbc1066c42c48561a4e2bd40b18248751ae");
}